

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::second_tick(torrent *this,int tick_interval_ms)

{
  _Atomic_word *p_Var1;
  pointer *pppVar2;
  undefined1 *puVar3;
  byte bVar4;
  ulong uVar5;
  pointer pppVar6;
  peer_connection *this_00;
  service_type *psVar7;
  undefined4 uVar8;
  bool bVar9;
  uint uVar10;
  time_point32 tVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  long *plVar14;
  wait_op *op;
  long lVar15;
  template_rebind_alloc<wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10344:35),_any_executor<context_as_t<execution_context_&>,_never_t<0>,_prefer_only<possibly_t<>_>,_prefer_only<tracked_t<>_>,_prefer_only<untracked_t<>_>,_prefer_only<fork_t<>_>,_prefer_only<continuation_t<>_>_>_>_>
  a;
  undefined8 uVar16;
  long lVar17;
  pointer pppVar18;
  _List_node_base *p_Var19;
  shared_ptr<libtorrent::aux::torrent> self;
  undefined1 local_68 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  wait_op *pwStack_40;
  scheduler_operation *local_38;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> local_30;
  
  local_68._20_4_ = tick_interval_ms;
  ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::torrent,void>
            ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
  p_Var19 = (_List_node_base *)&this->m_extensions;
  while (p_Var19 = (((_List_base<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
                      *)&p_Var19->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var19 != (_List_node_base *)&this->m_extensions) {
    (**(code **)(*(long *)p_Var19[1]._M_next + 0x28))();
  }
  uVar10 = (uint)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48;
  if ((uVar10 >> 0x1a & 1) == 0) {
    if (((uVar10 >> 0x18 & 1) != 0) && ((this->field_0x600 & 1) != 0)) {
      tVar11 = time_now32();
      iVar13 = (this->m_upload_mode_time).__d.__r;
      iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x2e])();
      local_68._24_8_ = CONCAT44(extraout_var,iVar12) + 0x438;
      local_48._M_pi = local_48._M_pi & 0xffffffffffffff00;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_68 + 0x18));
      local_48._M_pi._0_1_ = 1;
      iVar12 = *(int *)(CONCAT44(extraout_var,iVar12) + 0x2ac);
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_68 + 0x18));
      if (iVar12 <= (int)tVar11.__d.__r - iVar13) {
        set_upload_mode(this,false);
      }
    }
    uVar5 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
    if ((int)uVar5 < 0 || (uVar5 & 0x18000000) == 0) {
      iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x2e])();
      local_68._24_8_ = CONCAT44(extraout_var_00,iVar13) + 0x438;
      local_48._M_pi = local_48._M_pi & 0xffffffffffffff00;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_68 + 0x18));
      local_48._M_pi._0_1_ = 1;
      uVar10 = *(uint *)(CONCAT44(extraout_var_00,iVar13) + 0x428);
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_68 + 0x18));
      if ((uVar10 >> 0x10 & 1) != 0) {
        iVar13 = limit_impl(this,0);
        iVar12 = limit_impl(this,1);
        if ((0 < iVar12) &&
           (iVar12 <= *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>
                               .field_0x58)) {
          iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[5])();
          if ((*(uint *)(CONCAT44(extraout_var_03,iVar12) + 0x68) >> 9 & 1) != 0) {
            iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[5])();
            get_handle((torrent *)local_68);
            local_68._24_4_ = 3;
            alert_manager::
            emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                      ((alert_manager *)CONCAT44(extraout_var_04,iVar12),(torrent_handle *)local_68,
                       (performance_warning_t *)(local_68 + 0x18));
            if ((piece_picker *)local_68._8_8_ != (piece_picker *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var1 = (_Atomic_word *)
                         ((long)&(((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                                 super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                 ).
                                 super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 4);
                iVar12 = *p_Var1;
                *p_Var1 = *p_Var1 + -1;
                UNLOCK();
              }
              else {
                iVar12 = *(_Atomic_word *)
                          ((long)&(((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ).
                                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4);
                *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ).
                                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar12 + -1;
              }
              if (iVar12 == 1) {
                (**(_func_int **)
                   ((((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ).
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start + 3))();
              }
            }
          }
        }
        if ((0 < iVar13) &&
           (iVar13 <= *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>
                               .field_0x48)) {
          iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[5])();
          if ((*(uint *)(CONCAT44(extraout_var_07,iVar13) + 0x68) >> 9 & 1) != 0) {
            iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[5])();
            get_handle((torrent *)local_68);
            local_68._24_4_ = 2;
            alert_manager::
            emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                      ((alert_manager *)CONCAT44(extraout_var_08,iVar13),(torrent_handle *)local_68,
                       (performance_warning_t *)(local_68 + 0x18));
            if ((piece_picker *)local_68._8_8_ != (piece_picker *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var1 = (_Atomic_word *)
                         ((long)&(((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                                 super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                 ).
                                 super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 4);
                iVar13 = *p_Var1;
                *p_Var1 = *p_Var1 + -1;
                UNLOCK();
              }
              else {
                iVar13 = *(_Atomic_word *)
                          ((long)&(((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ).
                                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4);
                *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ).
                                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar13 + -1;
              }
              if (iVar13 == 1) {
                (**(_func_int **)
                   ((((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ).
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start + 3))();
              }
            }
          }
        }
      }
      if (((this->m_time_critical_pieces).
           super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (this->m_time_critical_pieces).
           super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (((this->super_torrent_hot_members).field_0x4b & 0x81) == 0)) {
        request_time_critical_pieces(this);
      }
      maybe_connect_web_seeds(this);
      this->m_swarm_last_seen_complete = this->m_last_seen_complete;
      pppVar6 = (this->super_torrent_hot_members).m_connections.
                super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                .
                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pppVar18 = (this->super_torrent_hot_members).m_connections.
                      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      .
                      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; pppVar18 != pppVar6;
          pppVar18 = pppVar18 + 1) {
        this_00 = *pppVar18;
        lVar17 = this_00->m_last_seen_complete;
        lVar15 = this->m_swarm_last_seen_complete;
        if (this->m_swarm_last_seen_complete < lVar17) {
          lVar15 = lVar17;
        }
        this->m_swarm_last_seen_complete = lVar15;
        peer_connection::second_tick(this_00,local_68._20_4_);
      }
      iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])();
      if ((*(uint *)(CONCAT44(extraout_var_01,iVar13) + 0x68) >> 0xb & 1) != 0) {
        iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[5])();
        get_handle((torrent *)local_68);
        alert_manager::
        emplace_alert<libtorrent::stats_alert,libtorrent::torrent_handle,int_const&,libtorrent::aux::stat&>
                  ((alert_manager *)CONCAT44(extraout_var_02,iVar13),(torrent_handle *)local_68,
                   (int *)(local_68 + 0x14),&this->m_stat);
        if ((_Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
             )local_68._8_8_ != (piece_picker *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = (_Atomic_word *)(local_68._8_8_ + 0xc);
            iVar13 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar13 = *(_Atomic_word *)(local_68._8_8_ + 0xc);
            *(int *)(local_68._8_8_ + 0xc) = iVar13 + -1;
          }
          if (iVar13 == 1) {
            (**(_func_int **)
               ((((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                ).
                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                ._M_impl.super__Vector_impl_data._M_start + 3))();
          }
        }
      }
      uVar8 = local_68._20_4_;
      this->m_total_uploaded =
           this->m_total_uploaded +
           (long)*(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                          field_0x8;
      this->m_total_downloaded =
           this->m_total_downloaded +
           (long)*(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                          field_0x28;
      lVar17 = 0x208;
      do {
        stat_channel::second_tick
                  ((stat_channel *)
                   ((long)((this->super_peer_class_set).m_class.
                           super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
                           ._M_elems + -0x19) + lVar17),uVar8);
        lVar17 = lVar17 + 0x10;
      } while (lVar17 != 0x268);
      bVar4 = (this->m_need_save_resume_data).m_val;
      if ((bVar4 & 8) == 0) {
        (this->m_need_save_resume_data).m_val = bVar4 | 8;
        state_updated(this);
      }
      iVar13 = *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                        field_0x1c +
               *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                        field_0xc;
      puVar3 = &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x4c;
      iVar12 = iVar13 + *(int *)puVar3;
      if ((iVar12 != 0 && SCARRY4(iVar13,*(int *)puVar3) == iVar12 < 0) ||
         (iVar13 = *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                            field_0x3c +
                   *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                            field_0x2c,
         puVar3 = &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x5c,
         iVar12 = iVar13 + *(int *)puVar3,
         iVar12 != 0 && SCARRY4(iVar13,*(int *)puVar3) == iVar12 < 0)) {
        state_updated(this);
      }
      bVar9 = is_inactive_internal(this);
      iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x2e])();
      local_68._24_8_ = CONCAT44(extraout_var_05,iVar13) + 0x438;
      local_48._M_pi = local_48._M_pi & 0xffffffffffffff00;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_68 + 0x18));
      local_48._M_pi._0_1_ = 1;
      uVar10 = *(uint *)(CONCAT44(extraout_var_05,iVar13) + 0x428);
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_68 + 0x18));
      if ((uVar10 >> 0xd & 1) != 0) {
        if (bVar9 == ((this->field_0x600 & 0x40) == 0)) {
          if ((*(uint *)&this->field_0x5d8 >> 0x1a & 1) == 0) {
            iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[0x2e])();
            local_68._24_8_ = CONCAT44(extraout_var_06,iVar13) + 0x438;
            local_48._M_pi = local_48._M_pi & 0xffffffffffffff00;
            ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_68 + 0x18));
            local_48._M_pi._0_1_ = 1;
            iVar13 = *(int *)(CONCAT44(extraout_var_06,iVar13) + 0x288);
            ::std::unique_lock<std::mutex>::~unique_lock
                      ((unique_lock<std::mutex> *)(local_68 + 0x18));
            local_68._24_8_ = (long)iVar13 * 1000000000;
            boost::asio::
            basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            ::expires_after(&this->m_inactivity_timer,(duration *)(local_68 + 0x18));
            local_68._0_8_ = local_38;
            local_68._8_8_ = local_30._M_head_impl;
            if ((tuple<libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 )local_30._M_head_impl !=
                (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                pppVar2 = &((local_30._M_head_impl)->m_piece_map).
                           super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                           .
                           super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *(int *)pppVar2 = *(int *)pppVar2 + 1;
                UNLOCK();
              }
              else {
                pppVar2 = &((local_30._M_head_impl)->m_piece_map).
                           super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                           .
                           super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *(int *)pppVar2 = *(int *)pppVar2 + 1;
              }
            }
            psVar7 = (this->m_inactivity_timer).impl_.service_;
            local_68._24_8_ = (element_type *)local_68;
            plVar14 = (long *)__tls_get_addr(&PTR_004eaf08);
            if (*plVar14 == 0) {
              uVar16 = 0;
            }
            else {
              uVar16 = *(undefined8 *)(*plVar14 + 8);
            }
            op = (wait_op *)
                 boost::asio::detail::thread_info_base::
                 allocate<boost::asio::detail::thread_info_base::default_tag>(uVar16,0x68);
            uVar16 = local_68._8_8_;
            (op->super_operation).next_ = (scheduler_operation *)0x0;
            (op->super_operation).func_ =
                 boost::asio::detail::
                 wait_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:10344:35),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 ::do_complete;
            (op->super_operation).task_result_ = 0;
            (op->ec_).val_ = 0;
            (op->ec_).failed_ = false;
            (op->ec_).cat_ =
                 &boost::system::detail::cat_holder<void>::system_category_instance.
                  super_error_category;
            local_68._8_8_ =
                 (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                  )0x0;
            op[1].super_operation.next_ = (scheduler_operation *)local_68._0_8_;
            op[1].super_operation.func_ = (func_type)uVar16;
            local_68._0_8_ = (_func_int **)0x0;
            local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)op;
            boost::asio::detail::
            handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
            ::handler_work_base((handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                                 *)&op[1].super_operation.task_result_,
                                &(this->m_inactivity_timer).impl_.executor_);
            (this->m_inactivity_timer).impl_.implementation_.might_have_pending_waits = true;
            pwStack_40 = op;
            boost::asio::detail::epoll_reactor::
            schedule_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                      (psVar7->scheduler_,&psVar7->timer_queue_,
                       &(this->m_inactivity_timer).impl_.implementation_.expiry,
                       &(this->m_inactivity_timer).impl_.implementation_.timer_data,op);
            local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pwStack_40 = (wait_op *)0x0;
            boost::asio::detail::
            wait_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:10344:35),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            ::ptr::reset((ptr *)(local_68 + 0x18));
            if ((piece_picker *)local_68._8_8_ != (piece_picker *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
            }
            this->field_0x5db = this->field_0x5db | 4;
          }
        }
        else if (((*(uint *)&this->field_0x5d8 >> 0x1a & 1) != 0) &&
                ((this->m_inactivity_timer).impl_.implementation_.might_have_pending_waits == true))
        {
          psVar7 = (this->m_inactivity_timer).impl_.service_;
          boost::asio::detail::epoll_reactor::
          cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                    (psVar7->scheduler_,&psVar7->timer_queue_,
                     &(this->m_inactivity_timer).impl_.implementation_.timer_data,0xffffffffffffffff
                    );
          (this->m_inactivity_timer).impl_.implementation_.might_have_pending_waits = false;
        }
      }
      bVar9 = want_tick(this);
      update_list(this,(torrent_list_index_t)0x1,bVar9);
    }
    else {
      iVar13 = *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                        field_0x1c +
               *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                        field_0xc;
      puVar3 = &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x4c;
      iVar12 = iVar13 + *(int *)puVar3;
      if ((iVar12 != 0 && SCARRY4(iVar13,*(int *)puVar3) == iVar12 < 0) ||
         (iVar13 = *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                            field_0x3c +
                   *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                            field_0x2c,
         puVar3 = &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x5c,
         iVar12 = iVar13 + *(int *)puVar3,
         iVar12 != 0 && SCARRY4(iVar13,*(int *)puVar3) == iVar12 < 0)) {
        state_updated(this);
      }
      uVar8 = local_68._20_4_;
      lVar17 = 0x208;
      do {
        stat_channel::second_tick
                  ((stat_channel *)
                   ((long)((this->super_peer_class_set).m_class.
                           super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
                           ._M_elems + -0x19) + lVar17),uVar8);
        lVar17 = lVar17 + 0x10;
      } while (lVar17 != 0x268);
      bVar9 = want_tick(this);
      update_list(this,(torrent_list_index_t)0x1,bVar9);
    }
  }
  if (local_30._M_head_impl != (piece_picker *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._M_head_impl);
  }
  return;
}

Assistant:

void torrent::second_tick(int const tick_interval_ms)
	{
		TORRENT_ASSERT(want_tick());
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		auto self = shared_from_this();

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& ext : m_extensions)
		{
			ext->tick();
		}

		if (m_abort) return;
#endif

		// if we're in upload only mode and we're auto-managed
		// leave upload mode every 10 minutes hoping that the error
		// condition has been fixed
		if (m_upload_mode && m_auto_managed && upload_mode_time() >=
			seconds(settings().get_int(settings_pack::optimistic_disk_retry)))
		{
			set_upload_mode(false);
		}

		if (is_paused() && !m_graceful_pause_mode)
		{
			// let the stats fade out to 0
			// check the rate before ticking the stats so that the last update is sent
			// with the rate equal to zero
			if (m_stat.low_pass_upload_rate() > 0 || m_stat.low_pass_download_rate() > 0)
				state_updated();
			m_stat.second_tick(tick_interval_ms);

			// the low pass transfer rate may just have dropped to 0
			update_want_tick();

			return;
		}

		if (settings().get_bool(settings_pack::rate_limit_ip_overhead))
		{
			int const up_limit = upload_limit();
			int const down_limit = download_limit();

			if (down_limit > 0
				&& m_stat.download_ip_overhead() >= down_limit
				&& alerts().should_post<performance_alert>())
			{
				alerts().emplace_alert<performance_alert>(get_handle()
					, performance_alert::download_limit_too_low);
			}

			if (up_limit > 0
				&& m_stat.upload_ip_overhead() >= up_limit
				&& alerts().should_post<performance_alert>())
			{
				alerts().emplace_alert<performance_alert>(get_handle()
					, performance_alert::upload_limit_too_low);
			}
		}

#ifndef TORRENT_DISABLE_STREAMING
		// ---- TIME CRITICAL PIECES ----

#if TORRENT_DEBUG_STREAMING > 0
		std::vector<partial_piece_info> queue;
		get_download_queue(&queue);

		std::vector<peer_info> peer_list;
		get_peer_info(peer_list);

		std::sort(queue.begin(), queue.end(), [](partial_piece_info const& lhs, partial_piece_info const& rhs)
			{ return lhs.piece_index < rhs.piece_index;; });

		std::printf("average piece download time: %.2f s (+/- %.2f s)\n"
			, m_average_piece_time / 1000.f
			, m_piece_time_deviation / 1000.f);
		for (auto& i : queue)
		{
			extern void print_piece(libtorrent::partial_piece_info* pp
				, std::vector<libtorrent::peer_info> const& peers
				, std::vector<time_critical_piece> const& time_critical);

			print_piece(&i, peer_list, m_time_critical_pieces);
		}
#endif // TORRENT_DEBUG_STREAMING

		if (!m_time_critical_pieces.empty() && !upload_mode())
		{
			request_time_critical_pieces();
		}
#endif // TORRENT_DISABLE_STREAMING

		// ---- WEB SEEDS ----

		maybe_connect_web_seeds();

		m_swarm_last_seen_complete = m_last_seen_complete;
		for (auto* p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);

			// look for the peer that saw a seed most recently
			m_swarm_last_seen_complete = std::max(p->last_seen_complete(), m_swarm_last_seen_complete);

			// updates the peer connection's ul/dl bandwidth
			// resource requests
			p->second_tick(tick_interval_ms);
		}
#if TORRENT_ABI_VERSION <= 2
		if (m_ses.alerts().should_post<stats_alert>())
			m_ses.alerts().emplace_alert<stats_alert>(get_handle(), tick_interval_ms, m_stat);
#endif

		m_total_uploaded += m_stat.last_payload_uploaded();
		m_total_downloaded += m_stat.last_payload_downloaded();
		m_stat.second_tick(tick_interval_ms);

		// these counters are saved in the resume data, since they updated
		// we need to save the resume data too
		set_need_save_resume(torrent_handle::if_counters_changed);

		// if the rate is 0, there's no update because of network transfers
		if (m_stat.low_pass_upload_rate() > 0 || m_stat.low_pass_download_rate() > 0)
			state_updated();

		// this section determines whether the torrent is active or not. When it
		// changes state, it may also trigger the auto-manage logic to reconsider
		// which torrents should be queued and started. There is a low pass
		// filter in order to avoid flapping (auto_manage_startup).
		bool is_inactive = is_inactive_internal();

		if (settings().get_bool(settings_pack::dont_count_slow_torrents))
		{
			if (is_inactive != m_inactive && !m_pending_active_change)
			{
				int const delay = settings().get_int(settings_pack::auto_manage_startup);
				m_inactivity_timer.expires_after(seconds(delay));
				m_inactivity_timer.async_wait([self](error_code const& ec) {
					self->wrap(&torrent::on_inactivity_tick, ec); });
				m_pending_active_change = true;
			}
			else if (is_inactive == m_inactive
				&& m_pending_active_change)
			{
				m_inactivity_timer.cancel();
			}
		}

		// want_tick depends on whether the low pass transfer rates are non-zero
		// or not. They may just have turned zero in this last tick.
		update_want_tick();
	}